

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::DumpFunctionId(FunctionBody *this,bool pad)

{
  uint uVar1;
  bool bVar2;
  LocalFunctionId LVar3;
  SourceContextInfo *pSVar4;
  char16_t *pcVar5;
  uint sourceContextId;
  bool pad_local;
  FunctionBody *this_local;
  
  pSVar4 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
  uVar1 = pSVar4->sourceContextId;
  if (uVar1 == 0xffffffff) {
    bVar2 = ParseableFunctionInfo::IsDynamicScript(&this->super_ParseableFunctionInfo);
    if (bVar2) {
      pcVar5 = L"Dyn#%d";
      if (pad) {
        pcVar5 = L"Dy.%-3d";
      }
      LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      Output::Print(pcVar5,(ulong)LVar3);
    }
    else {
      pcVar5 = L"#%d";
      if (pad) {
        pcVar5 = L"%-5d";
      }
      LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      Output::Print(pcVar5,(ulong)LVar3);
    }
  }
  else {
    pcVar5 = L"#%d.%d";
    if (pad) {
      pcVar5 = L"%2d.%-3d";
    }
    LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    Output::Print(pcVar5,(ulong)uVar1,(ulong)LVar3);
  }
  return;
}

Assistant:

void FunctionBody::DumpFunctionId(bool pad)
    {
        uint sourceContextId = this->GetSourceContextInfo()->sourceContextId;
        if (sourceContextId == Js::Constants::NoSourceContext)
        {
            if (this->IsDynamicScript())
            {
                Output::Print(pad? _u("Dy.%-3d") : _u("Dyn#%d"), this->GetLocalFunctionId());
            }
            else
            {
                // Function from LoadFile
                Output::Print(pad? _u("%-5d") : _u("#%d"), this->GetLocalFunctionId());
            }
        }
        else
        {
            Output::Print(pad? _u("%2d.%-3d") : _u("#%d.%d"), sourceContextId, this->GetLocalFunctionId());
        }
    }